

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

bool __thiscall
sf::VertexBuffer::update(VertexBuffer *this,Vertex *vertices,size_t vertexCount,uint offset)

{
  long lVar1;
  _func_void_GLenum_GLsizeiptrARB_void_ptr_GLenum *p_Var2;
  GLenum GVar3;
  TransientContextLock local_2d;
  uint local_2c;
  TransientContextLock contextLock;
  size_t sStack_28;
  uint offset_local;
  size_t vertexCount_local;
  Vertex *vertices_local;
  VertexBuffer *this_local;
  
  if (this->m_buffer == 0) {
    this_local._7_1_ = false;
  }
  else if (vertices == (Vertex *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((offset == 0) || (offset + vertexCount <= this->m_size)) {
    local_2c = offset;
    sStack_28 = vertexCount;
    GlResource::TransientContextLock::TransientContextLock(&local_2d);
    (*sf_ptrc_glBindBufferARB)(0x8892,this->m_buffer);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                       ,0xb8,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer)");
    p_Var2 = sf_ptrc_glBufferDataARB;
    if (this->m_size <= sStack_28) {
      lVar1 = sStack_28 * 0x14;
      GVar3 = anon_unknown.dwarf_e46a5::usageToGlEnum(this->m_usage);
      (*p_Var2)(0x8892,lVar1,(void *)0x0,GVar3);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xbd,
                         "GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage))"
                        );
      this->m_size = sStack_28;
    }
    (*sf_ptrc_glBufferSubDataARB)(0x8892,(ulong)local_2c * 0x14,sStack_28 * 0x14,vertices);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                       ,0xc2,
                       "GLEXT_glBufferSubData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * offset, sizeof(Vertex) * vertexCount, vertices)"
                      );
    (*sf_ptrc_glBindBufferARB)(0x8892,0);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                       ,0xc4,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0)");
    this_local._7_1_ = true;
    GlResource::TransientContextLock::~TransientContextLock(&local_2d);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool VertexBuffer::update(const Vertex* vertices, std::size_t vertexCount, unsigned int offset)
{
    // Sanity checks
    if (!m_buffer)
        return false;

    if (!vertices)
        return false;

    if (offset && (offset + vertexCount > m_size))
        return false;

    TransientContextLock contextLock;

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));

    // Check if we need to resize or orphan the buffer
    if (vertexCount >= m_size)
    {
        glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage)));

        m_size = vertexCount;
    }

    glCheck(GLEXT_glBufferSubData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * offset, sizeof(Vertex) * vertexCount, vertices));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    return true;
}